

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

bool __thiscall
wasm::PrintSExpression::maybePrintUnreachableReplacement
          (PrintSExpression *this,Expression *curr,Type type)

{
  Index *this_00;
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  Iterator IVar4;
  undefined1 local_f8 [8];
  Unreachable unreachable;
  Drop drop;
  Expression *child;
  undefined1 local_b8 [8];
  Iterator __end1;
  undefined1 local_88 [8];
  Iterator __begin1;
  ChildIterator *__range1;
  Expression *local_28;
  Expression *curr_local;
  PrintSExpression *this_local;
  Type type_local;
  
  __range1._4_4_ = 1;
  local_28 = curr;
  curr_local = (Expression *)this;
  this_local = (PrintSExpression *)type.id;
  bVar1 = wasm::Type::operator!=((Type *)&this_local,(BasicType *)((long)&__range1 + 4));
  if (bVar1) {
    type_local.id._7_1_ = false;
  }
  else {
    std::operator<<(this->o,"(block");
    if ((this->minify & 1U) == 0) {
      poVar2 = std::operator<<(this->o," ;; (replaces unreachable ");
      pcVar3 = getExpressionName(local_28);
      poVar2 = std::operator<<(poVar2,pcVar3);
      std::operator<<(poVar2," we can\'t emit)");
    }
    incIndent(this);
    this_00 = &__begin1.index;
    ChildIterator::ChildIterator((ChildIterator *)this_00,local_28);
    IVar4 = AbstractChildIterator<wasm::ChildIterator>::begin
                      ((AbstractChildIterator<wasm::ChildIterator> *)this_00);
    __end1._8_8_ = IVar4.parent;
    __begin1.parent._0_4_ = IVar4.index;
    local_88 = (undefined1  [8])__end1._8_8_;
    IVar4 = AbstractChildIterator<wasm::ChildIterator>::end
                      ((AbstractChildIterator<wasm::ChildIterator> *)this_00);
    local_b8 = (undefined1  [8])IVar4.parent;
    __end1.parent._0_4_ = IVar4.index;
    while( true ) {
      bVar1 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator!=
                        ((Iterator *)local_88,(Iterator *)local_b8);
      if (!bVar1) break;
      AbstractChildIterator<wasm::ChildIterator>::Iterator::operator*((Iterator *)local_88);
      Drop::Drop((Drop *)&unreachable.super_SpecificExpression<(wasm::Expression::Id)23>.
                          super_Expression.type);
      printFullLine(this,(Expression *)
                         &unreachable.super_SpecificExpression<(wasm::Expression::Id)23>.
                          super_Expression.type);
      AbstractChildIterator<wasm::ChildIterator>::Iterator::operator++((Iterator *)local_88);
    }
    ChildIterator::~ChildIterator((ChildIterator *)&__begin1.index);
    Unreachable::Unreachable((Unreachable *)local_f8);
    printFullLine(this,(Expression *)local_f8);
    decIndent(this);
    type_local.id._7_1_ = true;
  }
  return type_local.id._7_1_;
}

Assistant:

bool PrintSExpression::maybePrintUnreachableReplacement(Expression* curr,
                                                        Type type) {
  // When we cannot print an instruction because the child from which it's
  // supposed to get a type immediate is unreachable, then we print a
  // semantically-equivalent block that drops each of the children and ends in
  // an unreachable.
  if (type != Type::unreachable) {
    return false;
  }

  // Emit a block with drops of the children.
  o << "(block";
  if (!minify) {
    o << " ;; (replaces unreachable " << getExpressionName(curr)
      << " we can't emit)";
  }
  incIndent();
  for (auto* child : ChildIterator(curr)) {
    Drop drop;
    drop.value = child;
    printFullLine(&drop);
  }
  Unreachable unreachable;
  printFullLine(&unreachable);
  decIndent();
  return true;
}